

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

void __thiscall chrono::ChOptimizerGenetic::Mutation(ChOptimizerGenetic *this)

{
  double dVar1;
  ChGenotype *pCVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  uVar5 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  if (0 < *(int *)&(this->super_ChOptimizer).field_0x144) {
    lVar8 = 0;
    do {
      if (0 < (int)uVar5) {
        uVar6 = 0;
        bVar7 = false;
        do {
          dVar10 = ChRandom();
          if (dVar10 <= this->mutation_prob) {
            dVar10 = (this->super_ChOptimizer).xv_inf[uVar6];
            dVar1 = (this->super_ChOptimizer).xv_sup[uVar6];
            if (this->mutation == BOUNDARY) {
              auVar12._0_8_ = ChRandom();
              auVar12._8_56_ = extraout_var_00;
              uVar3 = vcmpsd_avx512f(auVar12._0_16_,ZEXT816(0x3fe0000000000000),1);
              bVar7 = (bool)((byte)uVar3 & 1);
              dVar9 = (double)((ulong)bVar7 * (long)dVar10 + (ulong)!bVar7 * (long)dVar1);
            }
            else {
              dVar9 = 0.0;
              if (this->mutation == UNIFORM) {
                auVar11._0_8_ = ChRandom();
                auVar11._8_56_ = extraout_var;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = dVar10;
                auVar13._8_8_ = 0;
                auVar13._0_8_ = dVar1 - dVar10;
                auVar4 = vfmadd213sd_fma(auVar13,auVar11._0_16_,auVar4);
                dVar9 = auVar4._0_8_;
              }
            }
            pCVar2 = this->population[lVar8];
            if ((pCVar2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows <= (long)uVar6) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            (pCVar2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data[uVar6] = dVar9;
            pCVar2->need_eval = true;
            bVar7 = true;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
        if (bVar7) {
          this->mutants = this->mutants + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < *(int *)&(this->super_ChOptimizer).field_0x144);
  }
  return;
}

Assistant:

void ChOptimizerGenetic::Mutation() {
    int nv = GetNumOfVars();
    double a1, a2, mutval;
    bool had_mutation;

    for (int i = 0; i < popsize; i++) {
        had_mutation = false;
        for (int mvar = 0; mvar < nv; mvar++) {
            if (ChRandom() <= mutation_prob) {
                // MUTATION of the fenotype variable...
                // Find the variable structure in variable linked list, with limits
                a1 = xv_inf[mvar];  // the random value of each variable
                a2 = xv_sup[mvar];  // must lie within the max/min
                // Perform mutation:
                switch (mutation) {
                    case MutationType::UNIFORM:
                        mutval = a1 + ChRandom() * (a2 - a1);
                        break;
                    case MutationType::BOUNDARY:
                        if (ChRandom() < 0.5)
                            mutval = a1;
                        else
                            mutval = a2;
                        break;
                    default:
                        mutval = 0;
                        break;
                }

                // store the mutated allele:
                population[i]->genes(mvar) = mutval;

                // the chromosomes have been changed, remember that
                // new fitness will be computed:
                population[i]->need_eval = true;

                had_mutation = true;
            }
        }
        if (had_mutation)
            mutants++;
    }
}